

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

void __thiscall ghc::filesystem::path::iterator::updateCurrent(iterator *this)

{
  char *pcVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  const_iterator last;
  
  pcVar1 = (this->_last)._M_current;
  first._M_current = (this->_iter)._M_current;
  if ((first._M_current != pcVar1) &&
     ((first._M_current == (this->_first)._M_current ||
      ((first._M_current + 1 != pcVar1 || first._M_current == (this->_root)._M_current) ||
       *first._M_current != '/')))) {
    last = increment(this,&this->_iter);
    assign<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              (&this->_current,first,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )last._M_current);
    return;
  }
  (this->_current)._path._M_string_length = 0;
  *(this->_current)._path._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void open(const path& p, std::ios_base::openmode mode = std::ios_base::in) { std::basic_ifstream<charT, traits>::open(p.string().c_str(), mode); }